

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O2

bool glslang::OutputSpvHex
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *spirv,char *baseName,
               char *varName)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  ostream *poVar4;
  void *this;
  long lVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  ofstream out;
  uint auStack_210 [120];
  
  std::ofstream::ofstream(&out);
  std::ofstream::open((char *)&out,(_Ios_Openmode)baseName);
  uVar1 = *(uint *)((long)auStack_210 + *(long *)(_out + -0x18));
  if ((uVar1 & 5) == 0) {
    poVar4 = std::operator<<((ostream *)&out,"\t// ");
    this = (void *)std::ostream::operator<<(poVar4,0xb);
    poVar4 = (ostream *)std::ostream::operator<<(this,0xf);
    poVar4 = std::operator<<(poVar4,".");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,2);
    poVar4 = std::operator<<(poVar4,".");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0);
    poVar4 = std::operator<<(poVar4,"");
    std::endl<char,std::char_traits<char>>(poVar4);
    if (varName != (char *)0x0) {
      poVar4 = std::operator<<((ostream *)&out,"\t #pragma once");
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)&out,"const uint32_t ");
      poVar4 = std::operator<<(poVar4,varName);
      poVar4 = std::operator<<(poVar4,"[] = {");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    for (lVar6 = 0;
        lVar6 < (int)((ulong)((long)(spirv->
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(spirv->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data._M_start) >> 2);
        lVar6 = lVar6 + 8) {
      std::operator<<((ostream *)&out,"\t");
      lVar7 = 8;
      for (lVar5 = lVar6;
          (bVar8 = lVar7 != 0, lVar7 = lVar7 + -1, bVar8 &&
          ((int)lVar5 <
           (int)((ulong)((long)(spirv->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(spirv->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_start) >> 2))); lVar5 = lVar5 + 1)
      {
        poVar4 = std::operator<<((ostream *)&out,"0x");
        lVar2 = *(long *)poVar4;
        lVar3 = *(long *)(lVar2 + -0x18);
        *(uint *)(poVar4 + lVar3 + 0x18) = *(uint *)(poVar4 + lVar3 + 0x18) & 0xffffffb5 | 8;
        *(undefined8 *)(poVar4 + *(long *)(lVar2 + -0x18) + 0x10) = 8;
        poVar4 = std::operator<<(poVar4,0x30);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        if ((int)lVar5 + 1 <
            (int)((ulong)((long)(spirv->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(spirv->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_start) >> 2)) {
          std::operator<<((ostream *)&out,",");
        }
      }
      std::endl<char,std::char_traits<char>>((ostream *)&out);
    }
    if (varName != (char *)0x0) {
      std::operator<<((ostream *)&out,"};");
      std::endl<char,std::char_traits<char>>((ostream *)&out);
    }
    std::ofstream::close();
  }
  else {
    printf("ERROR: Failed to open file: %s\n",baseName);
  }
  std::ofstream::~ofstream(&out);
  return (uVar1 & 5) == 0;
}

Assistant:

bool OutputSpvHex(const std::vector<unsigned int>& spirv, const char* baseName, const char* varName)
{
    std::ofstream out;
    out.open(baseName, std::ios::binary | std::ios::out);
    if (out.fail()) {
        printf("ERROR: Failed to open file: %s\n", baseName);
        return false;
    }
    out << "\t// " <<
        GetSpirvGeneratorVersion() <<
        GLSLANG_VERSION_MAJOR << "." << GLSLANG_VERSION_MINOR << "." << GLSLANG_VERSION_PATCH <<
        GLSLANG_VERSION_FLAVOR << std::endl;
    if (varName != nullptr) {
        out << "\t #pragma once" << std::endl;
        out << "const uint32_t " << varName << "[] = {" << std::endl;
    }
    const int WORDS_PER_LINE = 8;
    for (int i = 0; i < (int)spirv.size(); i += WORDS_PER_LINE) {
        out << "\t";
        for (int j = 0; j < WORDS_PER_LINE && i + j < (int)spirv.size(); ++j) {
            const unsigned int word = spirv[i + j];
            out << "0x" << std::hex << std::setw(8) << std::setfill('0') << word;
            if (i + j + 1 < (int)spirv.size()) {
                out << ",";
            }
        }
        out << std::endl;
    }
    if (varName != nullptr) {
        out << "};";
        out << std::endl;
    }
    out.close();
    return true;
}